

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetInlinedStringIndex
          (FieldGenerator *this,int32_t inlined_string_index)

{
  bool bVar1;
  LogMessage *other;
  mapped_type *pmVar2;
  int iVar3;
  AlphaNum *this_00;
  Hex hex;
  Hex hex_00;
  AlphaNum *in_stack_fffffffffffffbc8;
  allocator local_369;
  key_type local_368;
  AlphaNum local_348;
  undefined1 local_318 [12];
  AlphaNum local_308;
  AlphaNum local_2d8;
  string local_2a8;
  allocator local_281;
  key_type local_280;
  AlphaNum local_260;
  AlphaNum local_230;
  AlphaNum local_200;
  string local_1d0;
  allocator local_1a9;
  key_type local_1a8;
  AlphaNum local_188;
  undefined1 local_158 [12];
  AlphaNum local_148;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_88;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  FieldGenerator *pFStack_10;
  int32_t inlined_string_index_local;
  FieldGenerator *this_local;
  
  local_14 = inlined_string_index;
  pFStack_10 = this;
  bVar1 = IsStringInlined(this->descriptor_,this->options_);
  if (bVar1) {
    strings::AlphaNum::AlphaNum(&local_b8,"(_inlined_string_donated_[");
    iVar3 = local_14;
    if (local_14 < 0) {
      iVar3 = local_14 + 0x1f;
    }
    strings::AlphaNum::AlphaNum(&local_e8,iVar3 >> 5);
    strings::AlphaNum::AlphaNum(&local_118,"] & 0x");
    strings::Hex::Hex<unsigned_int>((Hex *)local_158,1 << ((byte)local_14 & 0x1f),ZERO_PAD_8);
    this_00 = &local_148;
    hex._12_4_ = 0;
    hex.value = local_158._0_8_;
    hex.spec = local_158._8_4_;
    strings::AlphaNum::AlphaNum(this_00,hex);
    strings::AlphaNum::AlphaNum(&local_188,"u) != 0;");
    StrCat_abi_cxx11_(&local_88,(protobuf *)&local_b8,&local_e8,&local_118,this_00,&local_188,
                      in_stack_fffffffffffffbc8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"inlined_string_donated",&local_1a9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_1a8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string((string *)&local_88);
    strings::AlphaNum::AlphaNum(&local_200,"_inlined_string_donated_[");
    iVar3 = local_14;
    if (local_14 < 0) {
      iVar3 = local_14 + 0x1f;
    }
    strings::AlphaNum::AlphaNum(&local_230,iVar3 >> 5);
    strings::AlphaNum::AlphaNum(&local_260,"]");
    StrCat_abi_cxx11_(&local_1d0,(protobuf *)&local_200,&local_230,&local_260,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"donating_states_word",&local_281);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_280);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    std::__cxx11::string::~string((string *)&local_1d0);
    strings::AlphaNum::AlphaNum(&local_2d8,"~0x");
    strings::Hex::Hex<unsigned_int>((Hex *)local_318,1 << ((byte)local_14 & 0x1f),ZERO_PAD_8);
    hex_00._12_4_ = 0;
    hex_00.value = local_318._0_8_;
    hex_00.spec = local_318._8_4_;
    strings::AlphaNum::AlphaNum(&local_308,hex_00);
    strings::AlphaNum::AlphaNum(&local_348,"u");
    StrCat_abi_cxx11_(&local_2a8,(protobuf *)&local_2d8,&local_308,&local_348,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"mask_for_undonate",&local_369);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_368);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  else {
    local_51 = 0;
    if (local_14 != -1) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
                 ,0x11f);
      local_51 = 1;
      other = internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: (inlined_string_index) == (-1): ");
      internal::LogFinisher::operator=(local_65,other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
  }
  return;
}

Assistant:

void FieldGenerator::SetInlinedStringIndex(int32_t inlined_string_index) {
  if (!IsStringInlined(descriptor_, options_)) {
    GOOGLE_CHECK_EQ(inlined_string_index, -1);
    return;
  }
  variables_["inlined_string_donated"] = StrCat(
      "(_inlined_string_donated_[", inlined_string_index / 32, "] & 0x",
      strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u) != 0;");
  variables_["donating_states_word"] =
      StrCat("_inlined_string_donated_[", inlined_string_index / 32, "]");
  variables_["mask_for_undonate"] = StrCat(
      "~0x", strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8),
      "u");
}